

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx512::OrientedDiscMiMBIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  byte bVar35;
  uint uVar36;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined4 uVar58;
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_290;
  undefined1 local_260 [32];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [2] [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar5 = context->scene;
  pGVar6 = (pSVar5->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar6->time_range).lower;
  fVar1 = pGVar6->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar6->time_range).upper - fVar1));
  auVar51 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  uVar29 = (ulong)(Disc->primIDs).field_0.i[0];
  auVar51 = vminss_avx(auVar51,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar39 = vmaxss_avx(ZEXT816(0) << 0x20,auVar51);
  lVar7 = *(long *)&pGVar6[2].numPrimitives;
  lVar34 = (long)(int)auVar39._0_4_ * 0x38;
  lVar8 = *(long *)(lVar7 + 0x10 + lVar34);
  lVar33 = *(long *)(lVar7 + lVar34);
  auVar51 = *(undefined1 (*) [16])(lVar33 + lVar8 * uVar29);
  uVar30 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar52 = *(undefined1 (*) [16])(lVar33 + lVar8 * uVar30);
  uVar31 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar53 = *(undefined1 (*) [16])(lVar33 + lVar8 * uVar31);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar55 = *(undefined1 (*) [16])(lVar33 + lVar8 * uVar32);
  p_Var9 = pGVar6[2].intersectionFilterN;
  lVar8 = *(long *)(p_Var9 + lVar34);
  lVar33 = *(long *)(p_Var9 + lVar34 + 0x10);
  auVar57 = *(undefined1 (*) [16])(lVar8 + lVar33 * uVar29);
  auVar45 = *(undefined1 (*) [16])(lVar8 + lVar33 * uVar30);
  auVar60 = *(undefined1 (*) [16])(lVar8 + lVar33 * uVar31);
  auVar54 = *(undefined1 (*) [16])(lVar8 + lVar33 * uVar32);
  lVar33 = (long)((int)auVar39._0_4_ + 1) * 0x38;
  lVar8 = *(long *)(lVar7 + lVar33);
  lVar7 = *(long *)(lVar7 + 0x10 + lVar33);
  auVar46 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar29);
  auVar48 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar30);
  auVar47 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar31);
  auVar49 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar32);
  lVar7 = *(long *)(p_Var9 + lVar33);
  lVar8 = *(long *)(p_Var9 + lVar33 + 0x10);
  auVar50 = *(undefined1 (*) [16])(lVar7 + uVar29 * lVar8);
  auVar62 = *(undefined1 (*) [16])(lVar7 + uVar30 * lVar8);
  auVar68 = *(undefined1 (*) [16])(lVar7 + uVar31 * lVar8);
  auVar69 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar32);
  auVar38 = vsubss_avx512f(ZEXT416((uint)fVar1),auVar39);
  auVar39 = vunpcklps_avx512vl(auVar51,auVar53);
  auVar51 = vunpckhps_avx(auVar51,auVar53);
  auVar53 = vunpcklps_avx(auVar52,auVar55);
  auVar52 = vunpckhps_avx(auVar52,auVar55);
  auVar40 = vunpcklps_avx512vl(auVar39,auVar53);
  auVar41 = vunpckhps_avx512vl(auVar39,auVar53);
  auVar39 = vunpcklps_avx(auVar51,auVar52);
  auVar44 = vunpcklps_avx(auVar57,auVar60);
  auVar53 = vunpckhps_avx(auVar57,auVar60);
  auVar57 = vunpcklps_avx(auVar45,auVar54);
  auVar55 = vunpckhps_avx(auVar45,auVar54);
  auVar42 = vunpcklps_avx512vl(auVar53,auVar55);
  auVar43 = vunpcklps_avx512vl(auVar44,auVar57);
  auVar44 = vunpckhps_avx512vl(auVar44,auVar57);
  auVar57 = vunpcklps_avx(auVar46,auVar47);
  auVar53 = vunpckhps_avx(auVar46,auVar47);
  auVar45 = vunpcklps_avx(auVar48,auVar49);
  auVar55 = vunpckhps_avx(auVar48,auVar49);
  auVar60 = vunpcklps_avx(auVar57,auVar45);
  auVar57 = vunpckhps_avx(auVar57,auVar45);
  auVar54 = vunpcklps_avx(auVar53,auVar55);
  auVar45 = vunpcklps_avx512vl(auVar50,auVar68);
  auVar46 = vunpckhps_avx512vl(auVar50,auVar68);
  auVar47 = vunpcklps_avx512vl(auVar62,auVar69);
  auVar48 = vunpckhps_avx512vl(auVar62,auVar69);
  auVar46 = vunpcklps_avx(auVar46,auVar48);
  auVar48 = vunpcklps_avx(auVar45,auVar47);
  auVar45 = vunpckhps_avx(auVar45,auVar47);
  auVar47 = vbroadcastss_avx512vl(auVar38);
  auVar49 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar38);
  uVar58 = auVar49._0_4_;
  auVar68._4_4_ = uVar58;
  auVar68._0_4_ = uVar58;
  auVar68._8_4_ = uVar58;
  auVar68._12_4_ = uVar58;
  fVar64 = auVar47._0_4_;
  auVar50._0_4_ = fVar64 * auVar60._0_4_;
  fVar65 = auVar47._4_4_;
  auVar50._4_4_ = fVar65 * auVar60._4_4_;
  fVar66 = auVar47._8_4_;
  auVar50._8_4_ = fVar66 * auVar60._8_4_;
  fVar67 = auVar47._12_4_;
  auVar50._12_4_ = fVar67 * auVar60._12_4_;
  auVar60._0_4_ = fVar64 * auVar57._0_4_;
  auVar60._4_4_ = fVar65 * auVar57._4_4_;
  auVar60._8_4_ = fVar66 * auVar57._8_4_;
  auVar60._12_4_ = fVar67 * auVar57._12_4_;
  auVar62._0_4_ = fVar64 * auVar54._0_4_;
  auVar62._4_4_ = fVar65 * auVar54._4_4_;
  auVar62._8_4_ = fVar66 * auVar54._8_4_;
  auVar62._12_4_ = fVar67 * auVar54._12_4_;
  auVar57 = vfmadd231ps_fma(auVar50,auVar68,auVar40);
  auVar60 = vfmadd231ps_fma(auVar60,auVar68,auVar41);
  auVar54 = vfmadd231ps_fma(auVar62,auVar68,auVar39);
  auVar47._0_4_ = fVar64 * auVar48._0_4_;
  auVar47._4_4_ = fVar65 * auVar48._4_4_;
  auVar47._8_4_ = fVar66 * auVar48._8_4_;
  auVar47._12_4_ = fVar67 * auVar48._12_4_;
  auVar48._0_4_ = fVar64 * auVar45._0_4_;
  auVar48._4_4_ = fVar65 * auVar45._4_4_;
  auVar48._8_4_ = fVar66 * auVar45._8_4_;
  auVar48._12_4_ = fVar67 * auVar45._12_4_;
  auVar49._0_4_ = fVar64 * auVar46._0_4_;
  auVar49._4_4_ = fVar65 * auVar46._4_4_;
  auVar49._8_4_ = fVar66 * auVar46._8_4_;
  auVar49._12_4_ = fVar67 * auVar46._12_4_;
  local_1f0 = vfmadd231ps_avx512vl(auVar47,auVar68,auVar43);
  local_1e0 = vfmadd231ps_avx512vl(auVar48,auVar68,auVar44);
  auVar45 = vpbroadcastd_avx512vl();
  uVar19 = vpcmpgtd_avx512vl(auVar45,_DAT_01f7fcf0);
  local_1b0 = vpbroadcastd_avx512vl();
  fVar1 = *(float *)(ray + k * 4);
  auVar69._4_4_ = fVar1;
  auVar69._0_4_ = fVar1;
  auVar69._8_4_ = fVar1;
  auVar69._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar39._4_4_ = fVar2;
  auVar39._0_4_ = fVar2;
  auVar39._8_4_ = fVar2;
  auVar39._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x40);
  auVar44._4_4_ = fVar3;
  auVar44._0_4_ = fVar3;
  auVar44._8_4_ = fVar3;
  auVar44._12_4_ = fVar3;
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar38._4_4_ = uVar58;
  auVar38._0_4_ = uVar58;
  auVar38._8_4_ = uVar58;
  auVar38._12_4_ = uVar58;
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  local_1d0[0] = vfmadd231ps_avx512vl(auVar49,auVar68,auVar42);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar45 = vmulps_avx512vl(local_1d0[0],auVar48);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar46,local_1e0);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar38,local_1f0);
  auVar47 = vxorps_avx512vl(auVar42,auVar42);
  uVar29 = vcmpps_avx512vl(auVar45,auVar47,0);
  auVar47 = vsubps_avx512vl(auVar57,auVar69);
  auVar49 = vsubps_avx512vl(auVar60,auVar39);
  auVar50 = vsubps_avx512vl(auVar54,auVar44);
  auVar50 = vmulps_avx512vl(local_1d0[0],auVar50);
  auVar49 = vfmadd231ps_avx512vl(auVar50,local_1e0,auVar49);
  auVar47 = vfmadd231ps_avx512vl(auVar49,local_1f0,auVar47);
  auVar45 = vdivps_avx512vl(auVar47,auVar45);
  bVar10 = (bool)((byte)uVar29 & 1);
  local_200._0_4_ = (uint)bVar10 * auVar47._0_4_ | (uint)!bVar10 * auVar45._0_4_;
  bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
  local_200._4_4_ = (uint)bVar10 * auVar47._4_4_ | (uint)!bVar10 * auVar45._4_4_;
  bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
  local_200._8_4_ = (uint)bVar10 * auVar47._8_4_ | (uint)!bVar10 * auVar45._8_4_;
  bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
  local_200._12_4_ = (uint)bVar10 * auVar47._12_4_ | (uint)!bVar10 * auVar45._12_4_;
  auVar70 = ZEXT1664(local_200);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar71 = ZEXT1664(auVar45);
  uVar17 = vcmpps_avx512vl(local_200,auVar45,2);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar45._4_4_ = uVar58;
  auVar45._0_4_ = uVar58;
  auVar45._8_4_ = uVar58;
  auVar45._12_4_ = uVar58;
  uVar18 = vcmpps_avx512vl(local_200,auVar45,0xd);
  bVar35 = (byte)uVar17 & (byte)uVar18 & ~(byte)uVar29 & (byte)uVar19 & 0xf;
  if (bVar35 != 0) {
    auVar51 = vunpckhps_avx(auVar51,auVar52);
    auVar52 = vunpckhps_avx(auVar53,auVar55);
    auVar53._0_4_ = fVar64 * auVar52._0_4_;
    auVar53._4_4_ = fVar65 * auVar52._4_4_;
    auVar53._8_4_ = fVar66 * auVar52._8_4_;
    auVar53._12_4_ = fVar67 * auVar52._12_4_;
    auVar55 = vfmadd231ps_fma(auVar53,auVar68,auVar51);
    auVar51 = vmulps_avx512vl(auVar38,local_200);
    auVar52 = vmulps_avx512vl(auVar46,local_200);
    auVar53 = vmulps_avx512vl(auVar48,local_200);
    auVar46._0_4_ = fVar1 + auVar51._0_4_;
    auVar46._4_4_ = fVar1 + auVar51._4_4_;
    auVar46._8_4_ = fVar1 + auVar51._8_4_;
    auVar46._12_4_ = fVar1 + auVar51._12_4_;
    auVar40._0_4_ = fVar2 + auVar52._0_4_;
    auVar40._4_4_ = fVar2 + auVar52._4_4_;
    auVar40._8_4_ = fVar2 + auVar52._8_4_;
    auVar40._12_4_ = fVar2 + auVar52._12_4_;
    auVar41._0_4_ = fVar3 + auVar53._0_4_;
    auVar41._4_4_ = fVar3 + auVar53._4_4_;
    auVar41._8_4_ = fVar3 + auVar53._8_4_;
    auVar41._12_4_ = fVar3 + auVar53._12_4_;
    auVar51 = vsubps_avx(auVar46,auVar57);
    auVar52 = vsubps_avx(auVar40,auVar60);
    auVar53 = vsubps_avx(auVar41,auVar54);
    auVar57._0_4_ = auVar53._0_4_ * auVar53._0_4_;
    auVar57._4_4_ = auVar53._4_4_ * auVar53._4_4_;
    auVar57._8_4_ = auVar53._8_4_ * auVar53._8_4_;
    auVar57._12_4_ = auVar53._12_4_ * auVar53._12_4_;
    auVar52 = vfmadd231ps_fma(auVar57,auVar52,auVar52);
    auVar51 = vfmadd231ps_fma(auVar52,auVar51,auVar51);
    auVar52._0_4_ = auVar55._0_4_ * auVar55._0_4_;
    auVar52._4_4_ = auVar55._4_4_ * auVar55._4_4_;
    auVar52._8_4_ = auVar55._8_4_ * auVar55._8_4_;
    auVar52._12_4_ = auVar55._12_4_ * auVar55._12_4_;
    uVar17 = vcmpps_avx512vl(auVar51,auVar52,1);
    bVar35 = bVar35 & (byte)uVar17;
    uVar36 = (uint)bVar35;
    if (bVar35 != 0) {
      local_220 = ZEXT432(0) << 0x20;
      auVar51._8_4_ = 0x7f800000;
      auVar51._0_8_ = 0x7f8000007f800000;
      auVar51._12_4_ = 0x7f800000;
      auVar59 = ZEXT1664(auVar51);
      auVar51 = vblendmps_avx512vl(auVar51,local_200);
      auVar55._4_4_ = (uint)(bVar35 >> 1 & 1) * auVar51._4_4_;
      auVar55._0_4_ = (uint)(bVar35 & 1) * auVar51._0_4_;
      auVar55._8_4_ = (uint)(bVar35 >> 2 & 1) * auVar51._8_4_;
      auVar55._12_4_ = (uint)(bVar35 >> 3) * auVar51._12_4_;
      auVar51 = vshufps_avx(auVar55,auVar55,0xb1);
      auVar51 = vminps_avx(auVar51,auVar55);
      auVar52 = vshufpd_avx(auVar51,auVar51,1);
      auVar51 = vminps_avx(auVar52,auVar51);
      uVar17 = vcmpps_avx512vl(auVar55,auVar51,0);
      bVar35 = (byte)uVar17 & bVar35;
      uVar28 = uVar36;
      if (bVar35 != 0) {
        uVar28 = (uint)bVar35;
      }
      uVar27 = 0;
      for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
        uVar27 = uVar27 + 1;
      }
      auVar56 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar61 = ZEXT3264(auVar56);
      auVar56 = vpcmpeqd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar54));
      auVar63 = ZEXT3264(auVar56);
      do {
        local_290.valid = (int *)local_260;
        local_230 = auVar70._0_16_;
        local_240 = auVar71._0_16_;
        uVar37 = uVar27 & 0xff;
        uVar28 = *(uint *)(local_1b0 + (ulong)uVar37 * 4);
        pGVar6 = (pSVar5->geometries).items[uVar28].ptr;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          bVar35 = ~(byte)(1 << (uVar27 & 0x1f)) & (byte)uVar36;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar29 = (ulong)(uVar37 << 2);
            uVar58 = *(undefined4 *)(local_220 + uVar29);
            uVar4 = *(undefined4 *)(local_220 + uVar29 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar29);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1f0 + uVar29);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1e0 + uVar29);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1d0[0] + uVar29);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar58;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x220) =
                 *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar29);
            *(uint *)(ray + k * 4 + 0x240) = uVar28;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            return;
          }
          uVar29 = (ulong)(uVar37 * 4);
          local_120 = *(undefined4 *)(local_220 + uVar29);
          local_100 = *(undefined4 *)(local_220 + uVar29 + 0x10);
          local_c0 = vpbroadcastd_avx512vl();
          uVar58 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar29);
          local_e0._4_4_ = uVar58;
          local_e0._0_4_ = uVar58;
          local_e0._8_4_ = uVar58;
          local_e0._12_4_ = uVar58;
          local_e0._16_4_ = uVar58;
          local_e0._20_4_ = uVar58;
          local_e0._24_4_ = uVar58;
          local_e0._28_4_ = uVar58;
          uVar58 = *(undefined4 *)(local_1f0 + uVar29);
          uVar4 = *(undefined4 *)(local_1e0 + uVar29);
          local_160._4_4_ = uVar4;
          local_160._0_4_ = uVar4;
          local_160._8_4_ = uVar4;
          local_160._12_4_ = uVar4;
          local_160._16_4_ = uVar4;
          local_160._20_4_ = uVar4;
          local_160._24_4_ = uVar4;
          local_160._28_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_1d0[0] + uVar29);
          local_140._4_4_ = uVar4;
          local_140._0_4_ = uVar4;
          local_140._8_4_ = uVar4;
          local_140._12_4_ = uVar4;
          local_140._16_4_ = uVar4;
          local_140._20_4_ = uVar4;
          local_140._24_4_ = uVar4;
          local_140._28_4_ = uVar4;
          local_180[0] = (RTCHitN)(char)uVar58;
          local_180[1] = (RTCHitN)(char)((uint)uVar58 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar58 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar58 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar58;
          local_180[5] = (RTCHitN)(char)((uint)uVar58 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar58 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar58 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar58;
          local_180[9] = (RTCHitN)(char)((uint)uVar58 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar58 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar58 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar58;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar58 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar58 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar58 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar58;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar58 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar58 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar58 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar58;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar58 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar58 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar58 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar58;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar58 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar58 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar58 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar58;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar58 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar58 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar58 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_290.hit = local_180;
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_200 + uVar29);
          local_260 = auVar61._0_32_;
          local_290.geometryUserPtr = pGVar6->userPtr;
          local_290.context = context->user;
          local_290.N = 8;
          local_1a0 = local_260;
          local_290.ray = (RTCRayN *)ray;
          if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar56 = ZEXT1632(auVar63._0_16_);
            (*pGVar6->intersectionFilterN)(&local_290);
            auVar56 = vpcmpeqd_avx2(auVar56,auVar56);
            auVar63 = ZEXT3264(auVar56);
            auVar61 = ZEXT3264(local_1a0);
            auVar59 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar71 = ZEXT1664(local_240);
            auVar70 = ZEXT1664(local_230);
          }
          if (local_260 == (undefined1  [32])0x0) {
LAB_01b42c79:
            *(int *)(ray + k * 4 + 0x100) = auVar71._0_4_;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              auVar56 = ZEXT1632(auVar63._0_16_);
              (*p_Var9)(&local_290);
              auVar56 = vpcmpeqd_avx2(auVar56,auVar56);
              auVar63 = ZEXT3264(auVar56);
              auVar61 = ZEXT3264(local_1a0);
              auVar59 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar71 = ZEXT1664(local_240);
              auVar70 = ZEXT1664(local_230);
            }
            if (local_260 == (undefined1  [32])0x0) goto LAB_01b42c79;
            uVar29 = vptestmd_avx512vl(local_260,local_260);
            iVar20 = *(int *)(local_290.hit + 4);
            iVar21 = *(int *)(local_290.hit + 8);
            iVar22 = *(int *)(local_290.hit + 0xc);
            iVar23 = *(int *)(local_290.hit + 0x10);
            iVar24 = *(int *)(local_290.hit + 0x14);
            iVar25 = *(int *)(local_290.hit + 0x18);
            iVar26 = *(int *)(local_290.hit + 0x1c);
            bVar35 = (byte)uVar29;
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar16 = SUB81(uVar29 >> 7,0);
            *(uint *)(local_290.ray + 0x180) =
                 (uint)(bVar35 & 1) * *(int *)local_290.hit |
                 (uint)!(bool)(bVar35 & 1) * *(int *)(local_290.ray + 0x180);
            *(uint *)(local_290.ray + 0x184) =
                 (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(local_290.ray + 0x184);
            *(uint *)(local_290.ray + 0x188) =
                 (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(local_290.ray + 0x188);
            *(uint *)(local_290.ray + 0x18c) =
                 (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x18c);
            *(uint *)(local_290.ray + 400) =
                 (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 400);
            *(uint *)(local_290.ray + 0x194) =
                 (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x194);
            *(uint *)(local_290.ray + 0x198) =
                 (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x198);
            *(uint *)(local_290.ray + 0x19c) =
                 (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x19c);
            iVar20 = *(int *)(local_290.hit + 0x24);
            iVar21 = *(int *)(local_290.hit + 0x28);
            iVar22 = *(int *)(local_290.hit + 0x2c);
            iVar23 = *(int *)(local_290.hit + 0x30);
            iVar24 = *(int *)(local_290.hit + 0x34);
            iVar25 = *(int *)(local_290.hit + 0x38);
            iVar26 = *(int *)(local_290.hit + 0x3c);
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar16 = SUB81(uVar29 >> 7,0);
            *(uint *)(local_290.ray + 0x1a0) =
                 (uint)(bVar35 & 1) * *(int *)(local_290.hit + 0x20) |
                 (uint)!(bool)(bVar35 & 1) * *(int *)(local_290.ray + 0x1a0);
            *(uint *)(local_290.ray + 0x1a4) =
                 (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(local_290.ray + 0x1a4);
            *(uint *)(local_290.ray + 0x1a8) =
                 (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(local_290.ray + 0x1a8);
            *(uint *)(local_290.ray + 0x1ac) =
                 (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1ac);
            *(uint *)(local_290.ray + 0x1b0) =
                 (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1b0);
            *(uint *)(local_290.ray + 0x1b4) =
                 (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x1b4);
            *(uint *)(local_290.ray + 0x1b8) =
                 (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x1b8);
            *(uint *)(local_290.ray + 0x1bc) =
                 (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x1bc);
            iVar20 = *(int *)(local_290.hit + 0x44);
            iVar21 = *(int *)(local_290.hit + 0x48);
            iVar22 = *(int *)(local_290.hit + 0x4c);
            iVar23 = *(int *)(local_290.hit + 0x50);
            iVar24 = *(int *)(local_290.hit + 0x54);
            iVar25 = *(int *)(local_290.hit + 0x58);
            iVar26 = *(int *)(local_290.hit + 0x5c);
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar16 = SUB81(uVar29 >> 7,0);
            *(uint *)(local_290.ray + 0x1c0) =
                 (uint)(bVar35 & 1) * *(int *)(local_290.hit + 0x40) |
                 (uint)!(bool)(bVar35 & 1) * *(int *)(local_290.ray + 0x1c0);
            *(uint *)(local_290.ray + 0x1c4) =
                 (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(local_290.ray + 0x1c4);
            *(uint *)(local_290.ray + 0x1c8) =
                 (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(local_290.ray + 0x1c8);
            *(uint *)(local_290.ray + 0x1cc) =
                 (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1cc);
            *(uint *)(local_290.ray + 0x1d0) =
                 (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1d0);
            *(uint *)(local_290.ray + 0x1d4) =
                 (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x1d4);
            *(uint *)(local_290.ray + 0x1d8) =
                 (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x1d8);
            *(uint *)(local_290.ray + 0x1dc) =
                 (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x1dc);
            iVar20 = *(int *)(local_290.hit + 100);
            iVar21 = *(int *)(local_290.hit + 0x68);
            iVar22 = *(int *)(local_290.hit + 0x6c);
            iVar23 = *(int *)(local_290.hit + 0x70);
            iVar24 = *(int *)(local_290.hit + 0x74);
            iVar25 = *(int *)(local_290.hit + 0x78);
            iVar26 = *(int *)(local_290.hit + 0x7c);
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar16 = SUB81(uVar29 >> 7,0);
            *(uint *)(local_290.ray + 0x1e0) =
                 (uint)(bVar35 & 1) * *(int *)(local_290.hit + 0x60) |
                 (uint)!(bool)(bVar35 & 1) * *(int *)(local_290.ray + 0x1e0);
            *(uint *)(local_290.ray + 0x1e4) =
                 (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(local_290.ray + 0x1e4);
            *(uint *)(local_290.ray + 0x1e8) =
                 (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(local_290.ray + 0x1e8);
            *(uint *)(local_290.ray + 0x1ec) =
                 (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1ec);
            *(uint *)(local_290.ray + 0x1f0) =
                 (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1f0);
            *(uint *)(local_290.ray + 500) =
                 (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 500);
            *(uint *)(local_290.ray + 0x1f8) =
                 (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x1f8);
            *(uint *)(local_290.ray + 0x1fc) =
                 (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x1fc);
            auVar56._0_4_ =
                 (uint)(bVar35 & 1) * *(int *)(local_290.hit + 0x80) |
                 (uint)!(bool)(bVar35 & 1) * *(int *)(local_290.ray + 0x200);
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar56._4_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x84) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x204);
            bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar56._8_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x88) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x208);
            bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
            auVar56._12_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x8c) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x20c);
            bVar10 = (bool)((byte)(uVar29 >> 4) & 1);
            auVar56._16_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x90) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x210);
            bVar10 = (bool)((byte)(uVar29 >> 5) & 1);
            auVar56._20_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x94) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x214);
            bVar10 = (bool)((byte)(uVar29 >> 6) & 1);
            auVar56._24_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x98) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x218);
            bVar10 = SUB81(uVar29 >> 7,0);
            auVar56._28_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x9c) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x21c);
            *(undefined1 (*) [32])(local_290.ray + 0x200) = auVar56;
            auVar56 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xa0));
            *(undefined1 (*) [32])(local_290.ray + 0x220) = auVar56;
            auVar56 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xc0));
            *(undefined1 (*) [32])(local_290.ray + 0x240) = auVar56;
            auVar56 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xe0));
            *(undefined1 (*) [32])(local_290.ray + 0x260) = auVar56;
            auVar56 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0x100));
            *(undefined1 (*) [32])(local_290.ray + 0x280) = auVar56;
            auVar71 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          auVar55 = vbroadcastss_avx512vl(auVar71._0_16_);
          uVar17 = vcmpps_avx512vl(auVar70._0_16_,auVar55,2);
          bVar35 = ~(byte)(1 << (uVar27 & 0x1f)) & (byte)uVar36 & (byte)uVar17;
        }
        uVar36 = (uint)bVar35;
        if (bVar35 == 0) {
          return;
        }
        auVar51 = vblendmps_avx512vl(auVar59._0_16_,auVar70._0_16_);
        auVar54._0_4_ =
             (uint)(bVar35 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar55._0_4_;
        bVar10 = (bool)(bVar35 >> 1 & 1);
        auVar54._4_4_ = (uint)bVar10 * auVar51._4_4_ | (uint)!bVar10 * auVar55._4_4_;
        bVar10 = (bool)(bVar35 >> 2 & 1);
        auVar54._8_4_ = (uint)bVar10 * auVar51._8_4_ | (uint)!bVar10 * auVar55._8_4_;
        auVar54._12_4_ =
             (uint)(bVar35 >> 3) * auVar51._12_4_ | (uint)!(bool)(bVar35 >> 3) * auVar55._12_4_;
        auVar51 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar51 = vminps_avx(auVar51,auVar54);
        auVar52 = vshufpd_avx(auVar51,auVar51,1);
        auVar51 = vminps_avx(auVar52,auVar51);
        uVar17 = vcmpps_avx512vl(auVar54,auVar51,0);
        bVar35 = (byte)uVar17 & bVar35;
        uVar28 = uVar36;
        if (bVar35 != 0) {
          uVar28 = (uint)bVar35;
        }
        uVar27 = 0;
        for (; auVar55 = auVar54, (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
          uVar27 = uVar27 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }